

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::BuildLocalStackingContext(Element *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  Vector<StackingContextChild> stacking_children;
  _Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_> local_28;
  
  this->stacking_context_dirty = false;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AddChildrenToStackingContext(this,(Vector<StackingContextChild> *)&local_28);
  ::std::
  __stable_sort<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_28._M_impl.super__Vector_impl_data._M_start,
             local_28._M_impl.super__Vector_impl_data._M_finish);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::resize
            (&this->stacking_context,
             (long)local_28._M_impl.super__Vector_impl_data._M_finish -
             (long)local_28._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_28._M_impl.super__Vector_impl_data._M_start >> 4);
      uVar2 = uVar2 + 1) {
    *(undefined8 *)
     ((long)(this->stacking_context).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar1) =
         *(undefined8 *)
          ((long)&(local_28._M_impl.super__Vector_impl_data._M_start)->element + lVar1 * 2);
    lVar1 = lVar1 + 8;
  }
  ::std::_Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
  ~_Vector_base(&local_28);
  return;
}

Assistant:

void Element::BuildLocalStackingContext()
{
	stacking_context_dirty = false;

	Vector<StackingContextChild> stacking_children;
	AddChildrenToStackingContext(stacking_children);
	std::stable_sort(stacking_children.begin(), stacking_children.end());

	stacking_context.resize(stacking_children.size());
	for (size_t i = 0; i < stacking_children.size(); i++)
		stacking_context[i] = stacking_children[i].element;
}